

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

parser_error parse_store(parser *p)

{
  ushort uVar1;
  int iVar2;
  void *pvVar3;
  undefined8 *v;
  char *pcVar4;
  uint *puVar5;
  
  pvVar3 = parser_priv(p);
  uVar1 = z_info->store_max;
  z_info->store_max = uVar1 + 1;
  v = (undefined8 *)mem_zalloc(0x90);
  *(uint *)(v + 3) = (uint)uVar1;
  *(uint16_t *)((long)v + 0x32) = z_info->store_inven_max;
  pcVar4 = parser_getstr(p,"name");
  pcVar4 = string_make(pcVar4);
  v[4] = pcVar4;
  iVar2 = strcmp(pcVar4,"Black Market");
  if (iVar2 == 0) {
    puVar5 = &store_black_market_idx;
  }
  else {
    iVar2 = strcmp(pcVar4,"Travelling Merchant");
    if (iVar2 == 0) {
      puVar5 = &store_merchant_idx;
    }
    else {
      iVar2 = strcmp(pcVar4,"Home");
      if (iVar2 != 0) goto LAB_001cf33a;
      puVar5 = &store_home_idx;
    }
  }
  *puVar5 = *(uint *)(v + 3);
LAB_001cf33a:
  *v = pvVar3;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_store(struct parser *p) {
	struct store *h = parser_priv(p);
	struct store *s;

	s = store_new(z_info->store_max++);
	s->name = string_make(parser_getstr(p, "name"));

	/* Note black market and home */
	if (streq(s->name, "Black Market")) {
		store_black_market_idx = s->sidx;
	} else if (streq(s->name, "Travelling Merchant")) {
		store_merchant_idx = s->sidx;
	} else if (streq(s->name, "Home")) {
		store_home_idx = s->sidx;
	}

	s->next = h;
	parser_setpriv(p, s);
	return PARSE_ERROR_NONE;
}